

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

void __thiscall tetgenmesh::outhullfaces(tetgenmesh *this,tetgenio *out)

{
  uint uVar1;
  tetgenbehavior *ptVar2;
  long lVar3;
  memorypool *pmVar4;
  void **ppvVar5;
  long lVar6;
  bool bVar7;
  int *piVar8;
  size_t sVar9;
  FILE *__stream;
  void *pvVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  char facefilename [1024];
  int local_43c;
  char local_438 [4];
  undefined2 auStack_434 [514];
  
  ptVar2 = this->b;
  if (out == (tetgenio *)0x0) {
    strcpy(local_438,ptVar2->outfilename);
    sVar9 = strlen(local_438);
    builtin_strncpy(local_438 + sVar9,".fac",4);
    *(undefined2 *)((long)auStack_434 + sVar9) = 0x65;
    if (ptVar2->quiet == 0) {
      printf("Writing %s.\n",local_438);
    }
    __stream = fopen(local_438,"w");
    if (__stream == (FILE *)0x0) {
      printf("File I/O Error:  Cannot create file %s.\n",local_438);
      puts("Error:  Out of memory.");
      exit(1);
    }
    piVar8 = (int *)0x0;
    fprintf(__stream,"%ld  0\n",this->hullsize);
  }
  else {
    if (ptVar2->quiet == 0) {
      puts("Writing faces.");
    }
    lVar3 = this->hullsize;
    __stream = (FILE *)0x0;
    piVar8 = (int *)operator_new__(-(ulong)((ulong)(lVar3 * 3) >> 0x3e != 0) | lVar3 * 0xc);
    out->trifacelist = piVar8;
    out->numberoftrifaces = (int)lVar3;
  }
  uVar1 = this->in->firstnumber;
  uVar15 = 0;
  if (this->b->zeroindex == 0) {
    uVar15 = uVar1;
  }
  bVar7 = uVar15 == 0;
  pmVar4 = this->tetrahedrons;
  ppvVar5 = pmVar4->firstblock;
  pmVar4->pathblock = ppvVar5;
  pmVar4->pathitem =
       (void *)((long)ppvVar5 +
               (((long)pmVar4->alignbytes + 8U) -
               (ulong)(ppvVar5 + 1) % (ulong)(long)pmVar4->alignbytes));
  pmVar4->pathitemsleft = pmVar4->itemsperblock;
  do {
    pvVar10 = memorypool::traverse(this->tetrahedrons);
    if (pvVar10 == (void *)0x0) {
LAB_0014e161:
      if (out == (tetgenio *)0x0) {
        fprintf(__stream,"# Generated by %s\n",this->b->commandline);
        fclose(__stream);
      }
      return;
    }
  } while (*(long *)((long)pvVar10 + 0x20) == 0);
  local_43c = 0;
  do {
    if (*(point *)((long)pvVar10 + 0x38) == this->dummypoint) {
      lVar3 = *(long *)((long)pvVar10 + 0x28);
      lVar12 = (long)this->pointmarkindex;
      uVar13 = (uint)(uVar1 == 1 && bVar7);
      uVar11 = *(int *)(*(long *)((long)pvVar10 + 0x20) + lVar12 * 4) - uVar13;
      lVar6 = *(long *)((long)pvVar10 + 0x30);
      if (out == (tetgenio *)0x0) {
        fprintf(__stream,"%5d   %4d  %4d  %4d",(ulong)uVar15,(ulong)uVar11,
                (ulong)(*(int *)(lVar3 + lVar12 * 4) - uVar13),
                (ulong)(*(int *)(lVar6 + lVar12 * 4) - uVar13));
        fputc(10,__stream);
      }
      else {
        lVar14 = (long)local_43c;
        piVar8[lVar14] = uVar11;
        piVar8[lVar14 + 1] = *(int *)(lVar3 + lVar12 * 4) - uVar13;
        local_43c = local_43c + 3;
        piVar8[lVar14 + 2] = *(int *)(lVar6 + lVar12 * 4) - uVar13;
      }
      uVar15 = uVar15 + 1;
    }
    do {
      pvVar10 = memorypool::traverse(this->tetrahedrons);
      if (pvVar10 == (void *)0x0) goto LAB_0014e161;
    } while (*(long *)((long)pvVar10 + 0x20) == 0);
  } while( true );
}

Assistant:

void tetgenmesh::outhullfaces(tetgenio* out)
{
  FILE *outfile = NULL;
  char facefilename[FILENAMESIZE];
  triface hulltet;
  point torg, tdest, tapex;
  int *elist = NULL;
  int firstindex, shift;
  int facenumber;
  int index;

  if (out == (tetgenio *) NULL) {
    strcpy(facefilename, b->outfilename);
    strcat(facefilename, ".face");
  }

  if (!b->quiet) {
    if (out == (tetgenio *) NULL) {
      printf("Writing %s.\n", facefilename);
    } else {
      printf("Writing faces.\n");
    }
  }

  if (out == (tetgenio *) NULL) {
    outfile = fopen(facefilename, "w");
    if (outfile == (FILE *) NULL) {
      printf("File I/O Error:  Cannot create file %s.\n", facefilename);
      terminatetetgen(this, 1);
    }
    fprintf(outfile, "%ld  0\n", hullsize);
  } else {
    // Allocate memory for 'trifacelist'.
    out->trifacelist = new int[hullsize * 3];
    if (out->trifacelist == (int *) NULL) {
      printf("Error:  Out of memory.\n");
      terminatetetgen(this, 1);
    }
    out->numberoftrifaces = hullsize;
    elist = out->trifacelist;
    index = 0;
  }

  // Determine the first index (0 or 1).
  firstindex = b->zeroindex ? 0 : in->firstnumber;
  shift = 0; // Default no shiftment.
  if ((in->firstnumber == 1) && (firstindex == 0)) {
    shift = 1; // Shift the output indices by 1.
  }

  tetrahedrons->traversalinit();
  hulltet.tet = alltetrahedrontraverse();
  facenumber = firstindex;
  while (hulltet.tet != (tetrahedron *) NULL) {
    if (ishulltet(hulltet)) {
      torg = (point) hulltet.tet[4];
      tdest = (point) hulltet.tet[5];
      tapex = (point) hulltet.tet[6];
      if (out == (tetgenio *) NULL) {
        // Face number, indices of three vertices.
        fprintf(outfile, "%5d   %4d  %4d  %4d", facenumber,
                pointmark(torg) - shift, pointmark(tdest) - shift,
                pointmark(tapex) - shift);
        fprintf(outfile, "\n");
      } else {
        // Output indices of three vertices.
        elist[index++] = pointmark(torg) - shift;
        elist[index++] = pointmark(tdest) - shift;
        elist[index++] = pointmark(tapex) - shift;
      }
      facenumber++;
    }
    hulltet.tet = alltetrahedrontraverse();
  }

  if (out == (tetgenio *) NULL) {
    fprintf(outfile, "# Generated by %s\n", b->commandline);
    fclose(outfile);
  }
}